

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void flush_all_helper(CPUState *src,run_on_cpu_func fn,run_on_cpu_data d)

{
  run_on_cpu_func fn_local;
  CPUState *src_local;
  run_on_cpu_data d_local;
  
  return;
}

Assistant:

static void flush_all_helper(CPUState *src, run_on_cpu_func fn,
                             run_on_cpu_data d)
{
#if 0
    CPUState *cpu;

    CPU_FOREACH(cpu) {
        if (cpu != src) {
            // async_run_on_cpu(cpu, fn, d);
            fn(cpu, d);
        }
    }
#endif
}